

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O1

ImplementsClauseSyntax * __thiscall
slang::parsing::Parser::parseImplementsClause(Parser *this,TokenKind keywordKind,Token *semi)

{
  bool bVar1;
  int iVar2;
  SourceLocation location;
  NameSyntax *pNVar3;
  undefined4 extraout_var;
  ImplementsClauseSyntax *pIVar4;
  Info *src;
  Info *extraout_RDX;
  Token keyword;
  Token TVar5;
  SmallVector<slang::syntax::TokenOrSyntax,_8UL> buffer;
  Token local_150;
  undefined8 local_140;
  _Variadic_union<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> local_138;
  uint local_128;
  undefined8 local_118;
  SmallVectorBase<slang::syntax::TokenOrSyntax> local_108 [4];
  
  bVar1 = ParserBase::peek(&this->super_ParserBase,keywordKind);
  if (!bVar1) {
    TVar5 = ParserBase::expect(&this->super_ParserBase,Semicolon);
    *semi = TVar5;
    return (ImplementsClauseSyntax *)0x0;
  }
  TVar5 = ParserBase::consume(&this->super_ParserBase);
  keyword.info = TVar5.info;
  local_140 = TVar5._0_8_;
  local_108[0].len = 0;
  local_108[0].cap = 8;
  local_108[0].data_ = (pointer)local_108[0].firstElement;
  local_150 = ParserBase::peek(&this->super_ParserBase);
  bVar1 = slang::syntax::SyntaxFacts::isSemicolon(local_150.kind);
  if (bVar1) {
    location = Token::location(&local_150);
    ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x340005,location);
  }
  else {
    bVar1 = slang::syntax::SyntaxFacts::isPossibleExpressionOrComma(local_150.kind);
    if (!bVar1) {
      ParserBase::reportMissingList
                (&this->super_ParserBase,local_150,Semicolon,semi,(DiagCode)0x340005);
      src = extraout_RDX;
      goto LAB_0032d5df;
    }
    do {
      local_150 = ParserBase::peek(&this->super_ParserBase);
      pNVar3 = parseName(this);
      local_138._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)pNVar3;
      local_128 = CONCAT31(local_128._1_3_,1);
      SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                (local_108,(TokenOrSyntax *)&local_138._M_first);
      TVar5 = ParserBase::peek(&this->super_ParserBase);
      bVar1 = slang::syntax::SyntaxFacts::isSemicolon(TVar5.kind);
      if ((bVar1) || (bVar1 = ParserBase::peek(&this->super_ParserBase,Comma), !bVar1)) break;
      local_138._M_first._M_storage =
           (_Uninitialized<slang::parsing::Token,_true>)
           ParserBase::expect(&this->super_ParserBase,Comma);
      local_128 = local_128 & 0xffffff00;
      SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                (local_108,(TokenOrSyntax *)&local_138._M_first);
      TVar5 = ParserBase::peek(&this->super_ParserBase);
      bVar1 = slang::syntax::SyntaxFacts::isSemicolon(TVar5.kind);
      if (bVar1) {
        ParserBase::reportMisplacedSeparator(&this->super_ParserBase);
        break;
      }
      TVar5 = ParserBase::peek(&this->super_ParserBase);
    } while (((local_150.kind != TVar5.kind) || (local_150.info != TVar5.info)) ||
            (bVar1 = ParserBase::
                     skipBadTokens<&slang::syntax::SyntaxFacts::isPossibleExpressionOrComma,&slang::syntax::SyntaxFacts::isSemicolon>
                               (&this->super_ParserBase,(DiagCode)0x340005,true), bVar1));
  }
  TVar5 = ParserBase::expect(&this->super_ParserBase,Semicolon);
  src = TVar5.info;
  *semi = TVar5;
LAB_0032d5df:
  iVar2 = SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
                    (local_108,(EVP_PKEY_CTX *)(this->super_ParserBase).alloc,(EVP_PKEY_CTX *)src);
  local_118 = CONCAT44(extraout_var,iVar2);
  local_128 = 3;
  local_138 = (_Variadic_union<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>)
              ZEXT816(0x4ece40);
  keyword.kind = (undefined2)local_140;
  keyword._2_1_ = local_140._2_1_;
  keyword.numFlags.raw = local_140._3_1_;
  keyword.rawLen = local_140._4_4_;
  pIVar4 = slang::syntax::SyntaxFactory::implementsClause
                     (&this->factory,keyword,
                      (SeparatedSyntaxList<slang::syntax::NameSyntax> *)&local_138._M_first);
  if (local_108[0].data_ != (pointer)local_108[0].firstElement) {
    free(local_108[0].data_);
  }
  return pIVar4;
}

Assistant:

ImplementsClauseSyntax* Parser::parseImplementsClause(TokenKind keywordKind, Token& semi) {
    if (!peek(keywordKind)) {
        semi = expect(TokenKind::Semicolon);
        return nullptr;
    }

    auto implements = consume();
    SmallVector<TokenOrSyntax, 8> buffer;
    parseList<isPossibleExpressionOrComma, isSemicolon>(buffer, TokenKind::Semicolon,
                                                        TokenKind::Comma, semi, RequireItems::True,
                                                        diag::ExpectedInterfaceClassName,
                                                        [this] { return &parseName(); });

    return &factory.implementsClause(implements, buffer.copy(alloc));
}